

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O0

void __thiscall SslTcpSocket::SslTcpSocket(SslTcpSocket *this,TcpSocket *pTcpSock)

{
  TcpSocketImpl *local_30;
  unique_ptr<SslTcpSocketImpl,_std::default_delete<SslTcpSocketImpl>_> local_28;
  BaseSocketImpl *local_20;
  BaseSocketImpl *pImpl;
  TcpSocket *pTcpSock_local;
  SslTcpSocket *this_local;
  
  pImpl = (BaseSocketImpl *)pTcpSock;
  pTcpSock_local = &this->super_TcpSocket;
  TcpSocket::TcpSocket(&this->super_TcpSocket,false);
  (this->super_TcpSocket).super_BaseSocket._vptr_BaseSocket =
       (_func_int **)&PTR__SslTcpSocket_001b8a98;
  local_20 = BaseSocket::GetImpl((BaseSocket *)pImpl);
  local_30 = (TcpSocketImpl *)this;
  if (local_20 != (BaseSocketImpl *)0x0) {
    __dynamic_cast(local_20,&BaseSocketImpl::typeinfo,&TcpSocketImpl::typeinfo,0);
  }
  std::make_unique<SslTcpSocketImpl,SslTcpSocket*,TcpSocketImpl*>
            ((SslTcpSocket **)&local_28,&local_30);
  std::unique_ptr<BaseSocketImpl,std::default_delete<BaseSocketImpl>>::operator=
            ((unique_ptr<BaseSocketImpl,std::default_delete<BaseSocketImpl>> *)
             &(this->super_TcpSocket).super_BaseSocket.Impl_,&local_28);
  std::unique_ptr<SslTcpSocketImpl,_std::default_delete<SslTcpSocketImpl>_>::~unique_ptr(&local_28);
  return;
}

Assistant:

SslTcpSocket::SslTcpSocket(const TcpSocket* pTcpSock) : TcpSocket(false)   // Switch from Tcp to Ssl/Tls
{
    auto pImpl = pTcpSock->GetImpl();
    Impl_ = make_unique<SslTcpSocketImpl>(this, dynamic_cast<TcpSocketImpl*>(pImpl));
}